

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O0

void dyadic_analyze_53_uint8_input
               (int levels,int width,int height,uint8_t *x,int pitch_x,tran_low_t *c,int pitch_c,
               int dwt_scale_bits,int hbd)

{
  long in_RCX;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  int in_R8D;
  long in_R9;
  uint16_t *x16;
  tran_low_t buffer [128];
  int hw;
  int hh;
  int nw;
  int nh;
  int j;
  int i;
  int lv;
  tran_low_t local_248 [129];
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  long local_28;
  int local_4;
  
  if (buffer[2] == 0) {
    for (local_30 = 0; local_30 < in_EDX; local_30 = local_30 + 1) {
      for (local_34 = 0; local_34 < in_ESI; local_34 = local_34 + 1) {
        *(uint *)(in_R9 + (long)(local_30 * (int)x16 + local_34) * 4) =
             (uint)*(byte *)(in_RCX + (local_30 * in_R8D + local_34)) << ((byte)buffer[0] & 0x1f);
      }
    }
  }
  else {
    for (local_30 = 0; local_30 < in_EDX; local_30 = local_30 + 1) {
      for (local_34 = 0; local_34 < in_ESI; local_34 = local_34 + 1) {
        *(uint *)(in_R9 + (long)(local_30 * (int)x16 + local_34) * 4) =
             (uint)*(ushort *)(in_RCX * 2 + (long)(local_30 * in_R8D + local_34) * 2) <<
             ((byte)buffer[0] & 0x1f);
      }
    }
  }
  local_2c = 0;
  local_44 = in_ESI;
  local_40 = in_EDX;
  local_28 = in_R9;
  local_4 = in_EDI;
  while( true ) {
    if (local_4 <= local_2c) {
      return;
    }
    local_38 = local_40;
    local_3c = local_44;
    if (local_40 < 2) break;
    if (local_44 < 2) {
      return;
    }
    local_44 = local_44 + 1 >> 1;
    local_40 = local_40 + 1 >> 1;
    for (local_30 = 0; local_30 < local_38; local_30 = local_30 + 1) {
      memcpy(local_248,(void *)(local_28 + (long)(local_30 * (int)x16) * 4),(long)local_3c << 2);
      analysis_53_row(local_3c,local_248,(tran_low_t *)(local_28 + (long)(local_30 * (int)x16) * 4),
                      (tran_low_t *)
                      (local_28 + (long)(local_30 * (int)x16) * 4 + (long)local_44 * 4));
    }
    for (local_34 = 0; local_34 < local_3c; local_34 = local_34 + 1) {
      for (local_30 = 0; local_30 < local_38; local_30 = local_30 + 1) {
        local_248[local_30 + local_38] =
             *(tran_low_t *)(local_28 + (long)(local_30 * (int)x16 + local_34) * 4);
      }
      analysis_53_col(local_38,local_248 + local_38,local_248,local_248 + local_40);
      for (local_30 = 0; local_30 < local_38; local_30 = local_30 + 1) {
        *(tran_low_t *)(local_28 + (long)(local_30 * (int)x16 + local_34) * 4) = local_248[local_30]
        ;
      }
    }
    local_2c = local_2c + 1;
  }
  return;
}

Assistant:

static void dyadic_analyze_53_uint8_input(int levels, int width, int height,
                                          const uint8_t *x, int pitch_x,
                                          tran_low_t *c, int pitch_c,
                                          int dwt_scale_bits, int hbd) {
  int lv, i, j, nh, nw, hh = height, hw = width;
  tran_low_t buffer[2 * DWT_MAX_LENGTH];

  if (hbd) {
    const uint16_t *x16 = CONVERT_TO_SHORTPTR(x);
    for (i = 0; i < height; i++) {
      for (j = 0; j < width; j++) {
        c[i * pitch_c + j] = x16[i * pitch_x + j] << dwt_scale_bits;
      }
    }
  } else {
    for (i = 0; i < height; i++) {
      for (j = 0; j < width; j++) {
        c[i * pitch_c + j] = x[i * pitch_x + j] << dwt_scale_bits;
      }
    }
  }

  for (lv = 0; lv < levels; lv++) {
    nh = hh;
    hh = (hh + 1) >> 1;
    nw = hw;
    hw = (hw + 1) >> 1;
    if ((nh < 2) || (nw < 2)) return;
    for (i = 0; i < nh; i++) {
      memcpy(buffer, &c[i * pitch_c], nw * sizeof(tran_low_t));
      analysis_53_row(nw, buffer, &c[i * pitch_c], &c[i * pitch_c] + hw);
    }
    for (j = 0; j < nw; j++) {
      for (i = 0; i < nh; i++) buffer[i + nh] = c[i * pitch_c + j];
      analysis_53_col(nh, buffer + nh, buffer, buffer + hh);
      for (i = 0; i < nh; i++) c[i * pitch_c + j] = buffer[i];
    }
  }
}